

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
::rehash(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int8_t iVar32;
  size_t sVar33;
  ulong uVar34;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
  *psVar35;
  ulong uVar36;
  EntryPointer it;
  long lVar37;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
  *psVar38;
  byte bVar39;
  undefined4 uVar40;
  double dVar41;
  undefined4 uVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar67;
  int iVar68;
  undefined1 auVar65 [16];
  int iVar69;
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ulong local_38;
  
  auVar44._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar44._8_4_ = (int)(this->num_elements >> 0x20);
  auVar44._12_4_ = 0x45300000;
  auVar45._0_8_ = (double)this->_max_load_factor;
  auVar45._8_8_ = 0;
  dVar41 = ceil(((auVar44._8_8_ - 1.9342813113834067e+25) + (auVar44._0_8_ - 4503599627370496.0)) /
                auVar45._0_8_);
  local_38 = (long)(dVar41 - 9.223372036854776e+18) & (long)dVar41 >> 0x3f | (long)dVar41;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar32 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar33 = this->num_slots_minus_one;
  if (sVar33 != 0) {
    sVar33 = sVar33 + 1;
  }
  if (local_38 != sVar33) {
    uVar34 = local_38 >> 1 | local_38;
    uVar34 = uVar34 >> 2 | uVar34;
    uVar34 = uVar34 >> 4 | uVar34;
    uVar34 = uVar34 >> 8 | uVar34;
    uVar34 = uVar34 >> 0x10 | uVar34;
    uVar34 = uVar34 >> 0x20 | uVar34;
    bVar39 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar34 - (uVar34 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar39 = log2(unsigned_long)::table[(uVar34 - (uVar34 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    psVar35 = __gnu_cxx::
              new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>
              ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>_>
                          *)this,local_38 + bVar39,(void *)0x0);
    auVar31 = _DAT_003e7450;
    auVar30 = _DAT_003e7440;
    auVar29 = _DAT_003e7430;
    auVar28 = _DAT_003e7420;
    auVar27 = _DAT_003e7410;
    auVar26 = _DAT_003e7400;
    auVar44 = _DAT_003e64d0;
    if (psVar35 !=
        (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
         *)(&psVar35[local_38 - 1].distance_from_desired + (uint)bVar39 * 0x30)) {
      uVar34 = (bVar39 + local_38) * 0x30 - 0x60;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar34;
      uVar40 = SUB164(auVar65 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
      uVar43 = (undefined4)(uVar34 / 0x180000000);
      auVar70._0_8_ = CONCAT44(uVar43,uVar40);
      auVar70._8_4_ = uVar40;
      auVar70._12_4_ = uVar43;
      auVar42._0_8_ = auVar70._0_8_ >> 5;
      auVar42._8_8_ = auVar70._8_8_ >> 5;
      uVar36 = 0;
      psVar38 = psVar35;
      do {
        auVar62._8_4_ = (int)uVar36;
        auVar62._0_8_ = uVar36;
        auVar62._12_4_ = (int)(uVar36 >> 0x20);
        auVar65 = auVar42 ^ auVar44;
        auVar70 = (auVar62 | auVar31) ^ auVar44;
        iVar64 = auVar65._0_4_;
        iVar83 = -(uint)(iVar64 < auVar70._0_4_);
        iVar67 = auVar65._4_4_;
        auVar72._4_4_ = -(uint)(iVar67 < auVar70._4_4_);
        iVar68 = auVar65._8_4_;
        iVar87 = -(uint)(iVar68 < auVar70._8_4_);
        iVar69 = auVar65._12_4_;
        auVar72._12_4_ = -(uint)(iVar69 < auVar70._12_4_);
        auVar12._4_4_ = iVar83;
        auVar12._0_4_ = iVar83;
        auVar12._8_4_ = iVar87;
        auVar12._12_4_ = iVar87;
        auVar45 = pshuflw(auVar45,auVar12,0xe8);
        auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar67);
        auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar69);
        auVar71._0_4_ = auVar71._4_4_;
        auVar71._8_4_ = auVar71._12_4_;
        auVar70 = pshuflw(in_XMM2,auVar71,0xe8);
        auVar72._0_4_ = auVar72._4_4_;
        auVar72._8_4_ = auVar72._12_4_;
        auVar65 = pshuflw(auVar45,auVar72,0xe8);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar65 | auVar70 & auVar45) ^ auVar46;
        auVar45 = packssdw(auVar46,auVar46);
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar38->distance_from_desired = -1;
        }
        auVar13._4_4_ = iVar83;
        auVar13._0_4_ = iVar83;
        auVar13._8_4_ = iVar87;
        auVar13._12_4_ = iVar87;
        auVar72 = auVar71 & auVar13 | auVar72;
        auVar45 = packssdw(auVar72,auVar72);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar2,auVar45 ^ auVar2);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._0_4_ >> 8 & 1) != 0) {
          psVar38[1].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | auVar30) ^ auVar44;
        auVar55._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar55._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar55._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar55._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar73._4_4_ = auVar55._0_4_;
        auVar73._0_4_ = auVar55._0_4_;
        auVar73._8_4_ = auVar55._8_4_;
        auVar73._12_4_ = auVar55._8_4_;
        iVar83 = -(uint)(auVar45._4_4_ == iVar67);
        iVar87 = -(uint)(auVar45._12_4_ == iVar69);
        auVar14._4_4_ = iVar83;
        auVar14._0_4_ = iVar83;
        auVar14._8_4_ = iVar87;
        auVar14._12_4_ = iVar87;
        auVar84._4_4_ = auVar55._4_4_;
        auVar84._0_4_ = auVar55._4_4_;
        auVar84._8_4_ = auVar55._12_4_;
        auVar84._12_4_ = auVar55._12_4_;
        auVar45 = auVar14 & auVar73 | auVar84;
        auVar45 = packssdw(auVar45,auVar45);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar3,auVar45 ^ auVar3);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
          psVar38[2].distance_from_desired = -1;
        }
        auVar45 = pshufhw(auVar45,auVar73,0x84);
        auVar15._4_4_ = iVar83;
        auVar15._0_4_ = iVar83;
        auVar15._8_4_ = iVar87;
        auVar15._12_4_ = iVar87;
        auVar70 = pshufhw(auVar55,auVar15,0x84);
        auVar65 = pshufhw(auVar45,auVar84,0x84);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar65 | auVar70 & auVar45) ^ auVar47;
        auVar45 = packssdw(auVar47,auVar47);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._0_4_ >> 0x18 & 1) != 0) {
          psVar38[3].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | auVar29) ^ auVar44;
        auVar56._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar56._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar56._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar56._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar16._4_4_ = auVar56._0_4_;
        auVar16._0_4_ = auVar56._0_4_;
        auVar16._8_4_ = auVar56._8_4_;
        auVar16._12_4_ = auVar56._8_4_;
        auVar70 = pshuflw(auVar84,auVar16,0xe8);
        auVar48._0_4_ = -(uint)(auVar45._0_4_ == iVar64);
        auVar48._4_4_ = -(uint)(auVar45._4_4_ == iVar67);
        auVar48._8_4_ = -(uint)(auVar45._8_4_ == iVar68);
        auVar48._12_4_ = -(uint)(auVar45._12_4_ == iVar69);
        auVar74._4_4_ = auVar48._4_4_;
        auVar74._0_4_ = auVar48._4_4_;
        auVar74._8_4_ = auVar48._12_4_;
        auVar74._12_4_ = auVar48._12_4_;
        auVar45 = pshuflw(auVar48,auVar74,0xe8);
        auVar75._4_4_ = auVar56._4_4_;
        auVar75._0_4_ = auVar56._4_4_;
        auVar75._8_4_ = auVar56._12_4_;
        auVar75._12_4_ = auVar56._12_4_;
        auVar65 = pshuflw(auVar56,auVar75,0xe8);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 & auVar70,(auVar65 | auVar45 & auVar70) ^ auVar4);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar38[4].distance_from_desired = -1;
        }
        auVar17._4_4_ = auVar56._0_4_;
        auVar17._0_4_ = auVar56._0_4_;
        auVar17._8_4_ = auVar56._8_4_;
        auVar17._12_4_ = auVar56._8_4_;
        auVar75 = auVar74 & auVar17 | auVar75;
        auVar65 = packssdw(auVar75,auVar75);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45,auVar65 ^ auVar5);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._4_2_ >> 8 & 1) != 0) {
          psVar38[5].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | auVar28) ^ auVar44;
        auVar57._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar57._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar57._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar57._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar76._4_4_ = auVar57._0_4_;
        auVar76._0_4_ = auVar57._0_4_;
        auVar76._8_4_ = auVar57._8_4_;
        auVar76._12_4_ = auVar57._8_4_;
        iVar83 = -(uint)(auVar45._4_4_ == iVar67);
        iVar87 = -(uint)(auVar45._12_4_ == iVar69);
        auVar18._4_4_ = iVar83;
        auVar18._0_4_ = iVar83;
        auVar18._8_4_ = iVar87;
        auVar18._12_4_ = iVar87;
        auVar85._4_4_ = auVar57._4_4_;
        auVar85._0_4_ = auVar57._4_4_;
        auVar85._8_4_ = auVar57._12_4_;
        auVar85._12_4_ = auVar57._12_4_;
        auVar45 = auVar18 & auVar76 | auVar85;
        auVar45 = packssdw(auVar45,auVar45);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar6,auVar45 ^ auVar6);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar38[6].distance_from_desired = -1;
        }
        auVar45 = pshufhw(auVar45,auVar76,0x84);
        auVar19._4_4_ = iVar83;
        auVar19._0_4_ = iVar83;
        auVar19._8_4_ = iVar87;
        auVar19._12_4_ = iVar87;
        auVar70 = pshufhw(auVar57,auVar19,0x84);
        auVar65 = pshufhw(auVar45,auVar85,0x84);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar65 | auVar70 & auVar45) ^ auVar49;
        auVar45 = packssdw(auVar49,auVar49);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._6_2_ >> 8 & 1) != 0) {
          psVar38[7].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | auVar27) ^ auVar44;
        auVar58._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar58._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar58._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar58._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar20._4_4_ = auVar58._0_4_;
        auVar20._0_4_ = auVar58._0_4_;
        auVar20._8_4_ = auVar58._8_4_;
        auVar20._12_4_ = auVar58._8_4_;
        auVar70 = pshuflw(auVar85,auVar20,0xe8);
        auVar50._0_4_ = -(uint)(auVar45._0_4_ == iVar64);
        auVar50._4_4_ = -(uint)(auVar45._4_4_ == iVar67);
        auVar50._8_4_ = -(uint)(auVar45._8_4_ == iVar68);
        auVar50._12_4_ = -(uint)(auVar45._12_4_ == iVar69);
        auVar77._4_4_ = auVar50._4_4_;
        auVar77._0_4_ = auVar50._4_4_;
        auVar77._8_4_ = auVar50._12_4_;
        auVar77._12_4_ = auVar50._12_4_;
        auVar45 = pshuflw(auVar50,auVar77,0xe8);
        auVar78._4_4_ = auVar58._4_4_;
        auVar78._0_4_ = auVar58._4_4_;
        auVar78._8_4_ = auVar58._12_4_;
        auVar78._12_4_ = auVar58._12_4_;
        auVar65 = pshuflw(auVar58,auVar78,0xe8);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar65 | auVar45 & auVar70) ^ auVar59;
        auVar65 = packssdw(auVar59,auVar59);
        auVar45 = packsswb(auVar45 & auVar70,auVar65);
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar38[8].distance_from_desired = -1;
        }
        auVar21._4_4_ = auVar58._0_4_;
        auVar21._0_4_ = auVar58._0_4_;
        auVar21._8_4_ = auVar58._8_4_;
        auVar21._12_4_ = auVar58._8_4_;
        auVar78 = auVar77 & auVar21 | auVar78;
        auVar65 = packssdw(auVar78,auVar78);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar65 = packssdw(auVar65 ^ auVar7,auVar65 ^ auVar7);
        auVar45 = packsswb(auVar45,auVar65);
        if ((auVar45._8_2_ >> 8 & 1) != 0) {
          psVar38[9].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | auVar26) ^ auVar44;
        auVar60._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar60._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar60._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar60._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar79._4_4_ = auVar60._0_4_;
        auVar79._0_4_ = auVar60._0_4_;
        auVar79._8_4_ = auVar60._8_4_;
        auVar79._12_4_ = auVar60._8_4_;
        iVar83 = -(uint)(auVar45._4_4_ == iVar67);
        iVar87 = -(uint)(auVar45._12_4_ == iVar69);
        auVar22._4_4_ = iVar83;
        auVar22._0_4_ = iVar83;
        auVar22._8_4_ = iVar87;
        auVar22._12_4_ = iVar87;
        auVar86._4_4_ = auVar60._4_4_;
        auVar86._0_4_ = auVar60._4_4_;
        auVar86._8_4_ = auVar60._12_4_;
        auVar86._12_4_ = auVar60._12_4_;
        auVar45 = auVar22 & auVar79 | auVar86;
        auVar45 = packssdw(auVar45,auVar45);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar8,auVar45 ^ auVar8);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar38[10].distance_from_desired = -1;
        }
        auVar45 = pshufhw(auVar45,auVar79,0x84);
        auVar23._4_4_ = iVar83;
        auVar23._0_4_ = iVar83;
        auVar23._8_4_ = iVar87;
        auVar23._12_4_ = iVar87;
        auVar70 = pshufhw(auVar60,auVar23,0x84);
        auVar65 = pshufhw(auVar45,auVar86,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar65 | auVar70 & auVar45) ^ auVar51;
        auVar45 = packssdw(auVar51,auVar51);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._10_2_ >> 8 & 1) != 0) {
          psVar38[0xb].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | _DAT_003e73f0) ^ auVar44;
        auVar61._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar61._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar61._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar61._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar24._4_4_ = auVar61._0_4_;
        auVar24._0_4_ = auVar61._0_4_;
        auVar24._8_4_ = auVar61._8_4_;
        auVar24._12_4_ = auVar61._8_4_;
        auVar70 = pshuflw(auVar86,auVar24,0xe8);
        auVar52._0_4_ = -(uint)(auVar45._0_4_ == iVar64);
        auVar52._4_4_ = -(uint)(auVar45._4_4_ == iVar67);
        auVar52._8_4_ = -(uint)(auVar45._8_4_ == iVar68);
        auVar52._12_4_ = -(uint)(auVar45._12_4_ == iVar69);
        auVar80._4_4_ = auVar52._4_4_;
        auVar80._0_4_ = auVar52._4_4_;
        auVar80._8_4_ = auVar52._12_4_;
        auVar80._12_4_ = auVar52._12_4_;
        auVar45 = pshuflw(auVar52,auVar80,0xe8);
        auVar81._4_4_ = auVar61._4_4_;
        auVar81._0_4_ = auVar61._4_4_;
        auVar81._8_4_ = auVar61._12_4_;
        auVar81._12_4_ = auVar61._12_4_;
        auVar65 = pshuflw(auVar61,auVar81,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 & auVar70,(auVar65 | auVar45 & auVar70) ^ auVar9);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar38[0xc].distance_from_desired = -1;
        }
        auVar25._4_4_ = auVar61._0_4_;
        auVar25._0_4_ = auVar61._0_4_;
        auVar25._8_4_ = auVar61._8_4_;
        auVar25._12_4_ = auVar61._8_4_;
        auVar81 = auVar80 & auVar25 | auVar81;
        auVar65 = packssdw(auVar81,auVar81);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45,auVar65 ^ auVar10);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._12_2_ >> 8 & 1) != 0) {
          psVar38[0xd].distance_from_desired = -1;
        }
        auVar45 = (auVar62 | _DAT_003e73e0) ^ auVar44;
        auVar53._0_4_ = -(uint)(iVar64 < auVar45._0_4_);
        auVar53._4_4_ = -(uint)(iVar67 < auVar45._4_4_);
        auVar53._8_4_ = -(uint)(iVar68 < auVar45._8_4_);
        auVar53._12_4_ = -(uint)(iVar69 < auVar45._12_4_);
        auVar82._4_4_ = auVar53._0_4_;
        auVar82._0_4_ = auVar53._0_4_;
        auVar82._8_4_ = auVar53._8_4_;
        auVar82._12_4_ = auVar53._8_4_;
        auVar63._4_4_ = -(uint)(auVar45._4_4_ == iVar67);
        auVar63._12_4_ = -(uint)(auVar45._12_4_ == iVar69);
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar66._4_4_ = auVar53._4_4_;
        auVar66._0_4_ = auVar53._4_4_;
        auVar66._8_4_ = auVar53._12_4_;
        auVar66._12_4_ = auVar53._12_4_;
        auVar65 = auVar63 & auVar82 | auVar66;
        auVar45 = packssdw(auVar53,auVar65);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar11,auVar45 ^ auVar11);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar38[0xe].distance_from_desired = -1;
        }
        auVar45 = pshufhw(auVar45,auVar82,0x84);
        in_XMM2 = pshufhw(auVar65,auVar63,0x84);
        in_XMM2 = in_XMM2 & auVar45;
        auVar45 = pshufhw(auVar45,auVar66,0x84);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar45 | in_XMM2) ^ auVar54;
        auVar45 = packssdw(auVar54,auVar54);
        auVar45 = packsswb(auVar45,auVar45);
        if ((auVar45._14_2_ >> 8 & 1) != 0) {
          psVar38[0xf].distance_from_desired = -1;
        }
        uVar36 = uVar36 + 0x10;
        psVar38 = psVar38 + 0x10;
      } while ((uVar34 / 0x30 + 0x10 & 0xfffffffffffffff0) != uVar36);
    }
    ((sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>_>
      *)(&psVar35[local_38 - 1].distance_from_desired + (uint)bVar39 * 0x30))->distance_from_desired
         = '\0';
    begin = this->entries;
    sVar33 = this->num_slots_minus_one;
    this->entries = psVar35;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar32;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar39;
    this->num_elements = 0;
    local_38 = sVar33;
    if (begin != begin + sVar33 + (long)max_lookups) {
      lVar37 = 0;
      do {
        if (-1 < (&begin->distance_from_desired)[lVar37]) {
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
          ::
          emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::DiagCode,std::allocator<slang::DiagCode>>>>>>
                      *)this,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<slang::DiagCode,_std::allocator<slang::DiagCode>_>_>
                              *)((long)&begin->field_1 + lVar37));
          pvVar1 = *(void **)((long)&begin->field_1 + lVar37 + 0x10);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,*(long *)((long)&begin->field_1 + lVar37 + 0x20) - (long)pvVar1);
          }
          (&begin->distance_from_desired)[lVar37] = -1;
        }
        lVar37 = lVar37 + 0x30;
      } while (sVar33 * 0x30 + (long)max_lookups * 0x30 != lVar37);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }